

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O3

PsocksDataSink * open_pipes(char *cmd,char **direction_args,char *index_arg,char **err)

{
  bool bVar1;
  char *__command;
  FILE *pFVar2;
  int *piVar3;
  char *pcVar4;
  long lVar5;
  FILE **ppFVar6;
  stdio_sink *psVar7;
  bool bVar8;
  FILE *local_58;
  FILE *local_50;
  char **local_48;
  char **local_40;
  char *local_38;
  
  ppFVar6 = &local_58;
  pcVar4 = (char *)0x0;
  lVar5 = 0;
  bVar1 = true;
  local_48 = err;
  local_40 = direction_args;
  local_38 = index_arg;
  do {
    bVar8 = bVar1;
    __command = dupprintf("%s %s %s",cmd,local_40[lVar5]);
    pFVar2 = popen(__command,"w");
    *ppFVar6 = pFVar2;
    safefree(__command);
    if (pFVar2 == (FILE *)0x0 && pcVar4 == (char *)0x0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      pcVar4 = dupprintf("%s",pcVar4);
    }
    lVar5 = 1;
    ppFVar6 = &local_50;
    bVar1 = false;
  } while (bVar8);
  if (pcVar4 == (char *)0x0) {
    psVar7 = (stdio_sink *)safemalloc(1,0x58,0);
    setvbuf(local_58,(char *)0x0,2,0);
    stdio_sink_init(psVar7,(FILE *)local_58);
    psVar7[2].binarysink_[0].write =
         (_func_void_BinarySink_ptr_void_ptr_size_t *)psVar7->binarysink_;
    setvbuf(local_50,(char *)0x0,2,0);
    stdio_sink_init(psVar7 + 1,(FILE *)local_50);
    psVar7[2].binarysink_[0].writefmtv =
         (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)psVar7[1].binarysink_;
    psVar7[2].fp = (FILE *)popen_free;
    psVar7 = psVar7 + 2;
  }
  else {
    ppFVar6 = &local_58;
    bVar1 = true;
    do {
      bVar8 = bVar1;
      if (*ppFVar6 != (FILE *)0x0) {
        pclose(*ppFVar6);
      }
      ppFVar6 = &local_50;
      bVar1 = false;
    } while (bVar8);
    *local_48 = pcVar4;
    psVar7 = (stdio_sink *)0x0;
  }
  return (PsocksDataSink *)psVar7;
}

Assistant:

static PsocksDataSink *open_pipes(
    const char *cmd, const char *const *direction_args,
    const char *index_arg, char **err)
{
    FILE *fp[2];
    char *errmsg = NULL;

    for (size_t i = 0; i < 2; i++) {
        /* No escaping needed: the provided command is already
         * shell-quoted, and our extra arguments are simple */
        char *command = dupprintf("%s %s %s", cmd,
                                  direction_args[i], index_arg);

        fp[i] = popen(command, "w");
        sfree(command);

        if (!fp[i]) {
            if (!errmsg)
                errmsg = dupprintf("%s", strerror(errno));
        }
    }

    if (errmsg) {
        for (size_t i = 0; i < 2; i++)
            if (fp[i])
                pclose(fp[i]);
        *err = errmsg;
        return NULL;
    }

    PsocksDataSinkPopen *pdsp = snew(PsocksDataSinkPopen);

    for (size_t i = 0; i < 2; i++) {
        setvbuf(fp[i], NULL, _IONBF, 0);
        stdio_sink_init(&pdsp->sink[i], fp[i]);
        pdsp->pds.s[i] = BinarySink_UPCAST(&pdsp->sink[i]);
    }

    pdsp->pds.free = popen_free;

    return &pdsp->pds;
}